

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall bidirectional::BiDirectional::joinLabels(BiDirectional *this)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  pointer pPVar5;
  vector<double,_std::allocator<double>_> *max_res;
  reference __b;
  Vertex *sink;
  pointer pSVar6;
  element_type *peVar7;
  type pdVar8;
  pointer pDVar9;
  const_reference pvVar10;
  Label *in_RDI;
  AdjVertex *adj_vertex;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  Label *merged_label;
  Label *bwd_label;
  const_iterator bwd_iter;
  double *edge_weight;
  int *m;
  OutArcIt a;
  Label *fwd_label;
  const_iterator fwd_iter;
  int *n;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  vector<labelling::Label,_std::allocator<labelling::Label>_> merged_labels_;
  __single_object bwd_min;
  __single_object fwd_min;
  double *HF;
  double UB;
  int *c_res;
  DiGraph *in_stack_fffffffffffffd68;
  Label *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  OutArcIt *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  BiDirectional *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9c;
  undefined1 in_stack_fffffffffffffd9d;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 uVar11;
  BiDirectional *in_stack_fffffffffffffda0;
  reference other;
  Label *this_00;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  Label *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdc4;
  undefined1 in_stack_fffffffffffffdc6;
  undefined1 in_stack_fffffffffffffdc7;
  undefined4 in_stack_fffffffffffffe40;
  int iVar12;
  undefined4 in_stack_fffffffffffffe44;
  Label *in_stack_fffffffffffffe48;
  BiDirectional local_170;
  int *local_b8;
  Arc local_a8;
  int local_a4;
  Arc local_a0 [4];
  reference local_90;
  Label *local_88;
  __normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  local_80;
  int *local_78;
  _Self local_70;
  _Self local_68;
  set<int,_std::less<int>,_std::allocator<int>_> *local_60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  Label *bwd_label_00;
  Label *fwd_label_00;
  
  fwd_label_00 = in_RDI;
  pPVar5 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
           operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                       *)0x246f38);
  bwd_label_00 = (Label *)&pPVar5->critical_res;
  adj_vertex = (AdjVertex *)getUB(in_stack_fffffffffffffda0);
  max_res = (vector<double,_std::allocator<double>_> *)
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)
                       &(in_RDI->unreachable_nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count
                       ,(long)*(int *)&bwd_label_00->weight);
  __b = std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),
                   (long)*(int *)&bwd_label_00->weight);
  sink = (Vertex *)std::min<double>((double *)max_res,__b);
  std::make_unique<double>();
  std::make_unique<double>();
  std::unique_ptr<double,_std::default_delete<double>_>::get
            ((unique_ptr<double,_std::default_delete<double>_> *)in_stack_fffffffffffffd70);
  std::unique_ptr<double,_std::default_delete<double>_>::get
            ((unique_ptr<double,_std::default_delete<double>_> *)in_stack_fffffffffffffd70);
  getMinimumWeights((BiDirectional *)
                    CONCAT17(in_stack_fffffffffffffdc7,
                             CONCAT16(in_stack_fffffffffffffdc6,
                                      CONCAT24(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
                            ),&in_stack_fffffffffffffdb8->weight,
                    (double *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::vector
            ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)0x247015);
  pSVar6 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
           operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                       *)0x247029);
  local_60 = &pSVar6->visited_vertices;
  local_68._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd68);
  local_70._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd68);
  while (bVar2 = std::operator==(&local_68,&local_70), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_78 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)0x24708c);
    pSVar6 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
             operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                         *)0x2470a8);
    std::
    vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>::
    operator[](&pSVar6->best_labels,(long)*local_78);
    peVar7 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2470ca);
    dVar1 = peVar7->weight;
    pdVar8 = std::unique_ptr<double,_std::default_delete<double>_>::operator*
                       ((unique_ptr<double,_std::default_delete<double>_> *)
                        in_stack_fffffffffffffd70);
    if ((dVar1 + *pdVar8 <= (double)adj_vertex) &&
       (iVar12 = *local_78,
       pDVar9 = std::
                unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
                operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                            *)0x247138), iVar12 != (pDVar9->sink).lemon_id)) {
      pSVar6 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
               operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                           *)0x24715f);
      std::
      vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
      ::operator[](&pSVar6->efficient_labels,(long)*local_78);
      local_80._M_current =
           (Label *)std::vector<labelling::Label,_std::allocator<labelling::Label>_>::cbegin
                              ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)
                               in_stack_fffffffffffffd68);
      while( true ) {
        pSVar6 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                 ::operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               *)0x24719a);
        std::
        vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
        ::operator[](&pSVar6->efficient_labels,(long)*local_78);
        local_88 = (Label *)std::vector<labelling::Label,_std::allocator<labelling::Label>_>::cend
                                      ((vector<labelling::Label,_std::allocator<labelling::Label>_>
                                        *)in_stack_fffffffffffffd68);
        bVar2 = __gnu_cxx::
                operator==<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                          ((__normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                            *)in_stack_fffffffffffffd70,
                           (__normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                            *)in_stack_fffffffffffffd68);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        local_90 = __gnu_cxx::
                   __normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                   ::operator*(&local_80);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_90->resource_consumption,(long)*(int *)&bwd_label_00->weight);
        if ((*pvVar10 <= (double)*sink) &&
           (dVar1 = local_90->weight,
           pdVar8 = std::unique_ptr<double,_std::default_delete<double>_>::operator*
                              ((unique_ptr<double,_std::default_delete<double>_> *)
                               in_stack_fffffffffffffd70), dVar1 + *pdVar8 <= (double)adj_vertex)) {
          std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
          operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                      *)0x247291);
          std::unique_ptr<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>::operator*
                    ((unique_ptr<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_> *)
                     in_stack_fffffffffffffd70);
          std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
          operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                      *)0x2472b8);
          local_a4 = (int)DiGraph::getLNodeFromId(in_stack_fffffffffffffd68,(int *)0x2472c8);
          lemon::DigraphExtender<lemon::SmartDigraphBase>::OutArcIt::OutArcIt
                    (in_stack_fffffffffffffd80,
                     (Digraph *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                     (Node *)in_stack_fffffffffffffd70);
          while( true ) {
            lemon::SmartDigraphBase::Arc::Arc(&local_a8);
            bVar2 = lemon::SmartDigraphBase::Arc::operator!=(local_a0,local_a8);
            if (!bVar2) break;
            std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
            operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                        *)0x247352);
            std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
            operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                        *)0x247361);
            local_170.bwd_search_ptr_._M_t.
            super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
            ._M_t.
            super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
            .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl._0_4_ =
                 DiGraph::head((DiGraph *)
                               CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                               (LemonArc *)in_stack_fffffffffffffd70);
            local_170.bwd_search_ptr_._M_t.
            super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
            ._M_t.
            super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
            .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl._4_4_ =
                 DiGraph::getId((DiGraph *)in_stack_fffffffffffffd70,
                                (LemonNode *)in_stack_fffffffffffffd68);
            local_b8 = (int *)((long)&local_170.bwd_search_ptr_._M_t.
                                      super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                              + 4);
            std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
            operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                        *)0x2473cc);
            local_170.fwd_search_ptr_._M_t.
            super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
            ._M_t.
            super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
            .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl =
                 (__uniq_ptr_data<bidirectional::Search,_std::default_delete<bidirectional::Search>,_true,_true>
                  )DiGraph::getWeight((DiGraph *)in_stack_fffffffffffffd70,
                                      (LemonArc *)in_stack_fffffffffffffd68);
            local_170.best_label_.super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
            bVar3 = checkVertexVisited(in_stack_fffffffffffffd90,
                                       (Directions *)
                                       CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88)
                                       ,(int *)in_stack_fffffffffffffd80);
            bVar2 = false;
            if (bVar3) {
              iVar12 = *local_b8;
              pDVar9 = std::
                       unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                       ::operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                                     *)0x247451);
              bVar2 = false;
              if (iVar12 != (pDVar9->source).lemon_id) {
                in_stack_fffffffffffffdb8 =
                     (Label *)(local_90->weight +
                              *(double *)
                               local_170.fwd_search_ptr_._M_t.
                               super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                               .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl);
                pSVar6 = std::
                         unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                         ::operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                       *)0x247495);
                std::
                vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                ::operator[](&pSVar6->best_labels,(long)*local_b8);
                peVar7 = std::
                         __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x2474b7);
                bVar2 = (double)in_stack_fffffffffffffdb8 + peVar7->weight <= (double)adj_vertex;
              }
            }
            if (bVar2) {
              pSVar6 = std::
                       unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                       ::operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                     *)0x2474f6);
              std::
              vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
              ::operator[](&pSVar6->efficient_labels,(long)*local_b8);
              local_170.best_label_.super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)
                        std::vector<labelling::Label,_std::allocator<labelling::Label>_>::cbegin
                                  ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)
                                   in_stack_fffffffffffffd68);
              while( true ) {
                pSVar6 = std::
                         unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                         ::operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                       *)0x247531);
                std::
                vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                ::operator[](&pSVar6->efficient_labels,(long)*local_b8);
                local_170.min_res_curr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)std::vector<labelling::Label,_std::allocator<labelling::Label>_>::cend
                                        ((vector<labelling::Label,_std::allocator<labelling::Label>_>
                                          *)in_stack_fffffffffffffd68);
                bVar2 = __gnu_cxx::
                        operator==<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                                  ((__normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                                    *)in_stack_fffffffffffffd70,
                                   (__normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                                    *)in_stack_fffffffffffffd68);
                if (((bVar2 ^ 0xffU) & 1) == 0) break;
                local_170.min_res_curr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     &__gnu_cxx::
                      __normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                      ::operator*((__normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                                   *)&local_170.best_label_)->weight;
                pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&((reference)
                                      local_170.min_res_curr_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish)->resource_consumption,
                                     (long)*(int *)&bwd_label_00->weight);
                if ((((double)*sink <= *pvVar10) &&
                    (local_90->weight +
                     *(double *)
                      local_170.fwd_search_ptr_._M_t.
                      super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                      .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl +
                     *local_170.min_res_curr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish <= (double)adj_vertex)) &&
                   (uVar4 = labelling::mergePreCheck
                                      (in_stack_fffffffffffffe48,
                                       (Label *)CONCAT44(in_stack_fffffffffffffe44,
                                                         in_stack_fffffffffffffe40),max_res),
                   (bool)uVar4)) {
                  other = local_90;
                  this_00 = (Label *)local_170.min_res_curr_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                  std::
                  unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
                  operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                              *)0x247651);
                  DiGraph::getAdjVertex
                            ((DiGraph *)in_stack_fffffffffffffdb8,
                             (LemonArc *)CONCAT17(uVar4,in_stack_fffffffffffffdb0),(bool *)this_00);
                  std::
                  unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
                  operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                              *)0x24768c);
                  in_stack_fffffffffffffd68 =
                       (DiGraph *)
                       &(in_RDI->resource_consumption).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish;
                  labelling::mergeLabels
                            (fwd_label_00,bwd_label_00,adj_vertex,sink,in_stack_ffffffffffffffd8,
                             in_stack_00000010);
                  AdjVertex::~AdjVertex((AdjVertex *)0x2476d6);
                  local_170.min_res_curr_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)&local_170;
                  uVar11 = false;
                  if ((int)local_170.max_res.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish != -1) {
                    in_stack_fffffffffffffd9e =
                         labelling::Label::checkFeasibility
                                   (in_stack_fffffffffffffdb8,
                                    (vector<double,_std::allocator<double>_> *)
                                    CONCAT17(uVar4,in_stack_fffffffffffffdb0),
                                    (vector<double,_std::allocator<double>_> *)this_00,(bool *)other
                                   );
                    uVar11 = false;
                    if ((bool)in_stack_fffffffffffffd9e) {
                      in_stack_fffffffffffffd9d =
                           labelling::halfwayCheck
                                     ((Label *)(ulong)CONCAT16(in_stack_fffffffffffffd9e,
                                                               CONCAT15(in_stack_fffffffffffffd9d,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98))),
                                      (vector<labelling::Label,_std::allocator<labelling::Label>_> *
                                      )in_stack_fffffffffffffd90);
                      uVar11 = in_stack_fffffffffffffd9d;
                    }
                  }
                  if ((bool)uVar11 == false) {
LAB_002479a2:
                    std::vector<labelling::Label,_std::allocator<labelling::Label>_>::push_back
                              ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)
                               in_stack_fffffffffffffd80,
                               (value_type *)
                               CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
                    iVar12 = 0;
                  }
                  else {
                    peVar7 = std::
                             __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x247783);
                    in_stack_fffffffffffffd9c = true;
                    if ((peVar7->vertex).lemon_id != -1) {
                      in_stack_fffffffffffffd90 =
                           (BiDirectional *)
                           local_170.min_res_curr_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                      std::
                      __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)in_stack_fffffffffffffd70);
                      bVar2 = labelling::Label::fullDominance
                                        (this_00,other,
                                         (Directions *)
                                         CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffd9e,
                                                                  CONCAT15(in_stack_fffffffffffffd9d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98)))));
                      in_stack_fffffffffffffd98 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd98);
                      in_stack_fffffffffffffd8f = true;
                      in_stack_fffffffffffffd9c = in_stack_fffffffffffffd8f;
                      if (!bVar2) {
                        in_stack_fffffffffffffd80 =
                             (OutArcIt *)
                             (((vector<double,_std::allocator<double>_> *)
                              local_170.min_res_curr_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                        peVar7 = std::
                                 __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)0x247814);
                        in_stack_fffffffffffffd8f =
                             (double)in_stack_fffffffffffffd80 < peVar7->weight;
                        in_stack_fffffffffffffd9c = in_stack_fffffffffffffd8f;
                      }
                    }
                    if ((bool)in_stack_fffffffffffffd9c == false) goto LAB_002479a2;
                    std::make_shared<labelling::Label,labelling::Label_const&>
                              ((Label *)CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffd9e,
                                                                 CONCAT15(in_stack_fffffffffffffd9d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98)))));
                    std::shared_ptr<labelling::Label>::operator=
                              ((shared_ptr<labelling::Label> *)in_stack_fffffffffffffd70,
                               (shared_ptr<labelling::Label> *)in_stack_fffffffffffffd68);
                    std::shared_ptr<labelling::Label>::~shared_ptr
                              ((shared_ptr<labelling::Label> *)0x24787e);
                    peVar7 = std::
                             __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x247892);
                    if (peVar7->weight < (double)adj_vertex) {
                      peVar7 = std::
                               __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x2478bd);
                      adj_vertex = (AdjVertex *)peVar7->weight;
                    }
                    in_stack_fffffffffffffe44 = 0;
                    std::
                    __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)in_stack_fffffffffffffd70);
                    in_stack_fffffffffffffd7f =
                         terminate((BiDirectional *)
                                   CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffd9e,
                                                            CONCAT15(in_stack_fffffffffffffd9d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98)))),
                                   (Directions *)in_stack_fffffffffffffd90,
                                   (Label *)CONCAT17(in_stack_fffffffffffffd8f,
                                                     in_stack_fffffffffffffd88));
                    if (!(bool)in_stack_fffffffffffffd7f) goto LAB_002479a2;
                    iVar12 = 1;
                  }
                  labelling::Label::~Label(in_stack_fffffffffffffd70);
                  if (iVar12 != 0) goto LAB_00247a43;
                  in_stack_fffffffffffffe40 = 0;
                }
                __gnu_cxx::
                __normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                ::operator++((__normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                              *)&local_170.best_label_);
              }
            }
            lemon::DigraphExtender<lemon::SmartDigraphBase>::OutArcIt::operator++
                      ((OutArcIt *)in_stack_fffffffffffffd70);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
        ::operator++(&local_80);
      }
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffd70);
  }
LAB_00247a43:
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::~vector
            ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)
             in_stack_fffffffffffffd80);
  std::unique_ptr<double,_std::default_delete<double>_>::~unique_ptr
            ((unique_ptr<double,_std::default_delete<double>_> *)in_stack_fffffffffffffd70);
  std::unique_ptr<double,_std::default_delete<double>_>::~unique_ptr
            ((unique_ptr<double,_std::default_delete<double>_> *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void BiDirectional::joinLabels() {
  // ref id with critical_res
  SPDLOG_INFO("Merging");
  const int&    c_res   = params_ptr_->critical_res;
  double        UB      = getUB();
  const double& HF      = std::min(max_res_curr_[c_res], min_res_curr_[c_res]);
  auto          fwd_min = std::make_unique<double>();
  auto          bwd_min = std::make_unique<double>();
  // lower bounds on forward and backward labels
  getMinimumWeights(fwd_min.get(), bwd_min.get());

  std::vector<labelling::Label> merged_labels_;

  // for each vertex visited forward
  for (const int& n : fwd_search_ptr_->visited_vertices) {
    // if bound check fwd_label
    if (fwd_search_ptr_->best_labels[n]->weight + *bwd_min <= UB &&
        n != graph_ptr_->sink.lemon_id) {
      // for each forward label at n
      for (auto fwd_iter = fwd_search_ptr_->efficient_labels[n].cbegin();
           fwd_iter != fwd_search_ptr_->efficient_labels[n].cend();
           ++fwd_iter) {
        const labelling::Label& fwd_label = *fwd_iter;
        // if bound check fwd_label
        if (fwd_label.resource_consumption[c_res] <= HF &&
            fwd_label.weight + *bwd_min <= UB) {
          // for each successor of n
          for (LemonGraph::OutArcIt a(
                   *graph_ptr_->lemon_graph_ptr, graph_ptr_->getLNodeFromId(n));
               a != lemon::INVALID;
               ++a) {
            const int&    m           = graph_ptr_->getId(graph_ptr_->head(a));
            const double& edge_weight = graph_ptr_->getWeight(a);
            if (checkVertexVisited(BWD, m) &&
                m != graph_ptr_->source.lemon_id &&
                (fwd_label.weight + edge_weight +
                     bwd_search_ptr_->best_labels[m]->weight <=
                 UB)) {
              // for each backward label at m
              for (auto bwd_iter =
                       bwd_search_ptr_->efficient_labels[m].cbegin();
                   bwd_iter != bwd_search_ptr_->efficient_labels[m].cend();
                   ++bwd_iter) {
                const labelling::Label& bwd_label = *bwd_iter;
                // TODO: should suffice with strict > HF, but Beasley 10
                // fails
                if (bwd_label.resource_consumption[c_res] >= HF &&
                    (fwd_label.weight + edge_weight + bwd_label.weight <= UB) &&
                    labelling::mergePreCheck(fwd_label, bwd_label, max_res)) {
                  const labelling::Label& merged_label = labelling::mergeLabels(
                      fwd_label,
                      bwd_label,
                      graph_ptr_->getAdjVertex(a, true),
                      graph_ptr_->sink,
                      max_res,
                      min_res);
                  if (merged_label.vertex.lemon_id != -1 &&
                      merged_label.checkFeasibility(max_res, min_res) &&
                      labelling::halfwayCheck(merged_label, merged_labels_)) {
                    if (best_label_->vertex.lemon_id == -1 ||
                        (merged_label.fullDominance(*best_label_, FWD) ||
                         merged_label.weight < best_label_->weight)) {
                      // Save
                      best_label_ =
                          std::make_shared<labelling::Label>(merged_label);
                      SPDLOG_INFO(
                          "\t {} \t | \t {}",
                          getElapsedTime(),
                          best_label_->weight);
                      // Tighten UB
                      if (best_label_->weight < UB) {
                        UB = best_label_->weight;
                      }
                      // Stop if time out or threshold found
                      if (terminate(FWD, *best_label_)) {
                        return;
                      }
                    }
                  }
                  // Add merged label to list
                  merged_labels_.push_back(merged_label);
                } // else
                  // break;
              }
            }
          }
        } // else
          // break;
      }
    }
  }
}